

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O1

QAccessibleInterface * __thiscall
QAccessibleMenuItem::childAt(QAccessibleMenuItem *this,int x,int y)

{
  char cVar1;
  int iVar2;
  QAccessibleInterface *pQVar3;
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  undefined1 local_50 [16];
  int local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (**(code **)(*(long *)this + 0x50))();
  do {
    if (iVar2 < 1) {
      pQVar3 = (QAccessibleInterface *)0x0;
      break;
    }
    iVar2 = iVar2 + -1;
    pQVar3 = (QAccessibleInterface *)(**(code **)(*(long *)this + 0x48))(this,iVar2);
    auVar4 = (**(code **)(*(long *)pQVar3 + 0x70))(pQVar3);
    local_40 = x;
    local_3c = y;
    local_50 = auVar4;
    cVar1 = QRect::contains((QPoint *)local_50,SUB81(&local_40,0));
  } while (cVar1 == '\0');
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleMenuItem::childAt(int x, int y ) const
{
    for (int i = childCount() - 1; i >= 0; --i) {
        QAccessibleInterface *childInterface = child(i);
        if (childInterface->rect().contains(x,y)) {
            return childInterface;
        }
    }
    return nullptr;
}